

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O2

void uv__fs_scandir_cleanup(uv_fs_t *req)

{
  void *pvVar1;
  uint uVar2;
  
  uVar2 = req->nbufs;
  if (uVar2 == 0) {
    uVar2 = 0;
  }
  else if (uVar2 != (uint)req->result) {
    uVar2 = uVar2 - 1;
    req->nbufs = uVar2;
  }
  pvVar1 = req->ptr;
  while (uVar2 < (uint)req->result) {
    free(*(void **)((long)pvVar1 + (ulong)uVar2 * 8));
    uVar2 = req->nbufs + 1;
    req->nbufs = uVar2;
  }
  free(req->ptr);
  req->ptr = (void *)0x0;
  return;
}

Assistant:

void uv__fs_scandir_cleanup(uv_fs_t* req) {
  uv__dirent_t** dents;

  unsigned int* nbufs = uv__get_nbufs(req);

  dents = req->ptr;
  if (*nbufs > 0 && *nbufs != (unsigned int) req->result)
    (*nbufs)--;
  for (; *nbufs < (unsigned int) req->result; (*nbufs)++)
    uv__fs_scandir_free(dents[*nbufs]);

  uv__fs_scandir_free(req->ptr);
  req->ptr = NULL;
}